

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall VolumeFile::parseSegment(VolumeFile *this)

{
  uint32_t uVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint *offset;
  uint *puVar6;
  uint *puVar7;
  
  piVar2 = (int *)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  if (this->m_swapEndian == true) {
    if (*piVar2 != 0x6e51745b) {
      return false;
    }
    uVar1 = swap_bytes(piVar2[1]);
    this->m_nameTreeOffset = uVar1;
    uVar1 = swap_bytes(piVar2[2]);
    this->m_extTreeOffset = uVar1;
    uVar1 = swap_bytes(piVar2[3]);
    this->m_nodeTreeOffset = uVar1;
    uVar5 = swap_bytes(piVar2[4]);
  }
  else {
    if (*piVar2 != 0x5b74516e) {
      return false;
    }
    this->m_nameTreeOffset = piVar2[1];
    this->m_extTreeOffset = piVar2[2];
    this->m_nodeTreeOffset = piVar2[3];
    uVar5 = piVar2[4];
  }
  puVar7 = (uint *)(piVar2 + 5);
  this->m_entryTreeCount = uVar5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_entryTreeOffsets,(ulong)uVar5);
  puVar3 = (this->m_entryTreeOffsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar6 = (this->m_entryTreeOffsets).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    uVar5 = *puVar7;
    uVar4 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (this->m_swapEndian == false) {
      uVar4 = uVar5;
    }
    puVar7 = puVar7 + 1;
    *puVar6 = uVar4;
  }
  return true;
}

Assistant:

bool VolumeFile::parseSegment()
{
	const auto* p = m_data.data();

	const auto segmentMagic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (segmentMagic != SEGMENT_MAGIC) {
		return false;
	}

	m_nameTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_extTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_nodeTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_entryTreeCount = VOLUME_READ_NEXT_SELF(p, uint32_t);

	m_entryTreeOffsets.resize(m_entryTreeCount);
	for (auto& offset: m_entryTreeOffsets) {
		offset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	}

	return true;
}